

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

_Bool clone_data(void **dst,void *src,size_t len)

{
  void *pvVar1;
  size_t len_local;
  void *src_local;
  void **dst_local;
  
  if (len == 0) {
    *dst = (void *)0x0;
    dst_local._7_1_ = true;
  }
  else {
    pvVar1 = wally_malloc(len);
    *dst = pvVar1;
    if (*dst != (void *)0x0) {
      memcpy(*dst,src,len);
    }
    dst_local._7_1_ = *dst != (void *)0x0;
  }
  return dst_local._7_1_;
}

Assistant:

bool clone_data(void **dst, const void *src, size_t len)
{
    if (!len) {
        *dst = NULL;
        return true;
    }
    *dst = wally_malloc(len);
    if (*dst)
        memcpy(*dst, src, len);
    return *dst != NULL;
}